

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptBlock.cpp
# Opt level: O2

void __thiscall ScriptBlock::~ScriptBlock(ScriptBlock *this)

{
  ICommand **ppIVar1;
  LocalFunction **ppLVar2;
  LocalFunction *this_00;
  ulong uVar3;
  
  (this->super_ICommand)._vptr_ICommand = (_func_int **)&PTR_execute_0010b8e8;
  for (uVar3 = 0; ppIVar1 = this->commands, uVar3 < this->commandsCount; uVar3 = uVar3 + 1) {
    operator_delete(ppIVar1[uVar3]);
  }
  if (ppIVar1 != (ICommand **)0x0) {
    operator_delete__(ppIVar1);
  }
  if (this->isRoot == true) {
    for (uVar3 = 0; ppLVar2 = this->functions, uVar3 < this->functionsCount; uVar3 = uVar3 + 1) {
      this_00 = ppLVar2[uVar3];
      if (this_00 != (LocalFunction *)0x0) {
        LocalFunction::~LocalFunction(this_00);
      }
      operator_delete(this_00);
    }
    if (ppLVar2 != (LocalFunction **)0x0) {
      operator_delete__(ppLVar2);
      return;
    }
  }
  return;
}

Assistant:

ScriptBlock::~ScriptBlock() {
	unsigned int i;
	for (i = 0; i < this->commandsCount; i++) {
		delete this->commands[i];
	}
	delete[] this->commands;
	
	if (this->isRoot) {
		for (i = 0; i < this->functionsCount; i++) {
			delete this->functions[i];
		}
		delete[] this->functions;
	}
}